

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Journal.h
# Opt level: O1

ostream * __thiscall
beast::Journal::ScopedStream::operator<<(ScopedStream *this,base_uint<256UL,_void> *t)

{
  int in_ECX;
  string local_30;
  
  jbcoin::strHex<unsigned_char_const*>(&local_30,(jbcoin *)t,&DAT_00000020,in_ECX);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->m_ostream,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return (ostream *)&this->m_ostream;
}

Assistant:

std::ostream&
Journal::ScopedStream::operator<< (T const& t) const
{
    m_ostream << t;
    return m_ostream;
}